

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

void __thiscall RtApiAlsa::callbackEvent(RtApiAlsa *this)

{
  ostringstream *poVar1;
  StreamMutex *__mutex;
  bool bVar2;
  undefined8 *puVar3;
  code *pcVar4;
  RtAudioFormat RVar5;
  undefined8 uVar6;
  _func_int *p_Var7;
  undefined1 *puVar8;
  StreamState SVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  StreamMode SVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  size_t sVar17;
  ostream *poVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  RtAudioFormat *pRVar23;
  RtApiAlsa *this_00;
  RtApi *this_01;
  pthread_mutex_t *__mutex_00;
  undefined8 uStack_90;
  RtAudioFormat RStack_88;
  unsigned_long local_80;
  snd_pcm_sframes_t frames;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  RtAudioFormat local_50;
  pthread_mutex_t *local_48;
  char *local_40;
  int local_34;
  
  pRVar23 = &RStack_88;
  puVar3 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
  SVar9 = (this->super_RtApi).stream_.state;
  if (SVar9 == STREAM_STOPPED) {
    __mutex = &(this->super_RtApi).stream_.mutex;
    uStack_90 = 0x10e952;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (*(char *)(puVar3 + 9) == '\0') {
      do {
        uStack_90 = 0x10e968;
        pthread_cond_wait((pthread_cond_t *)(puVar3 + 3),(pthread_mutex_t *)__mutex);
      } while (*(char *)(puVar3 + 9) != '\x01');
    }
    SVar9 = (this->super_RtApi).stream_.state;
    uStack_90 = 0x10e97e;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (SVar9 != STREAM_RUNNING) {
      return;
    }
    SVar9 = (this->super_RtApi).stream_.state;
  }
  if (SVar9 == STREAM_CLOSED) {
    uStack_90 = 0x10e9b5;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_RtApi).errorText_,0,
               (char *)(this->super_RtApi).errorText_._M_string_length,0x1160bf);
    RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    return;
  }
  pcVar4 = (code *)(this->super_RtApi).stream_.callbackInfo.callback;
  uStack_90 = 0x10e9e0;
  (*(this->super_RtApi)._vptr_RtApi[9])(this);
  SVar13 = (this->super_RtApi).stream_.mode;
  uVar19 = 0;
  if (SVar13 == INPUT) {
LAB_0010ea04:
    if (*(char *)((long)puVar3 + 0x12) == '\x01') {
      uVar19 = uVar19 | 1;
      *(undefined1 *)((long)puVar3 + 0x12) = 0;
    }
  }
  else {
    uVar19 = 0;
    if (*(char *)((long)puVar3 + 0x11) == '\x01') {
      *(undefined1 *)((long)puVar3 + 0x11) = 0;
      uVar19 = 2;
    }
    if (SVar13 != OUTPUT) goto LAB_0010ea04;
  }
  uStack_90 = 0x10ea31;
  iVar10 = (*pcVar4)((this->super_RtApi).stream_.userBuffer[0],
                     (this->super_RtApi).stream_.userBuffer[1],
                     (this->super_RtApi).stream_.bufferSize,uVar19,
                     (this->super_RtApi).stream_.callbackInfo.userData);
  if (iVar10 == 2) {
    (*(this->super_RtApi)._vptr_RtApi[8])(this);
    return;
  }
  __mutex_00 = (pthread_mutex_t *)&(this->super_RtApi).stream_.mutex;
  uStack_90 = 0x10ea5f;
  this_00 = (RtApiAlsa *)__mutex_00;
  pthread_mutex_lock(__mutex_00);
  if ((this->super_RtApi).stream_.state == STREAM_STOPPED) goto LAB_0010f01a;
  SVar13 = (this->super_RtApi).stream_.mode;
  pRVar23 = &RStack_88;
  local_48 = __mutex_00;
  local_34 = iVar10;
  if ((uint)(SVar13 + ~OUTPUT) < 2) {
    bVar2 = (this->super_RtApi).stream_.doConvertBuffer[1];
    pcVar15 = (this->super_RtApi).stream_.userBuffer[(ulong)bVar2 + 1];
    uVar19 = (this->super_RtApi).stream_.nUserChannels[(ulong)bVar2 * 2 + 1];
    RVar5 = (this->super_RtApi).stream_.deviceFormat[(ulong)bVar2 * 2 + -1];
    local_50 = RVar5;
    if ((this->super_RtApi).stream_.deviceInterleaved[1] == true) {
      this_01 = (RtApi *)puVar3[1];
      uStack_90 = 0x10eac7;
      iVar10 = snd_pcm_readi(this_01,pcVar15,(this->super_RtApi).stream_.bufferSize);
      pRVar23 = &RStack_88;
    }
    else {
      lVar16 = -((ulong)uVar19 * 8 + 0xf & 0xfffffffffffffff0);
      uVar14 = (this->super_RtApi).stream_.bufferSize;
      frames = (snd_pcm_sframes_t)&RStack_88;
      local_40 = pcVar15;
      *(undefined8 *)((long)&uStack_90 + lVar16) = 0x10eaf8;
      uVar11 = RtApi::formatBytes(&this->super_RtApi,RVar5);
      if (0 < (int)uVar19) {
        uVar22 = 0;
        pcVar15 = local_40;
        do {
          *(char **)((long)&RStack_88 + lVar16 + uVar22 * 8) = pcVar15;
          uVar22 = uVar22 + 1;
          pcVar15 = pcVar15 + uVar11 * uVar14;
        } while (uVar19 != uVar22);
      }
      this_01 = (RtApi *)puVar3[1];
      uVar14 = (this->super_RtApi).stream_.bufferSize;
      *(undefined8 *)((long)&uStack_90 + lVar16) = 0x10eb28;
      iVar10 = snd_pcm_readn(this_01,(long)&RStack_88 + lVar16,uVar14);
      pRVar23 = (RtAudioFormat *)frames;
      pcVar15 = local_40;
    }
    RVar5 = local_50;
    uVar14 = (this->super_RtApi).stream_.bufferSize;
    if (iVar10 < (int)uVar14) {
      if (iVar10 == -0x20) {
        uVar6 = puVar3[1];
        *(undefined8 *)((long)pRVar23 + -8) = 0x10eb51;
        iVar12 = snd_pcm_state(uVar6);
        iVar10 = local_34;
        if (iVar12 == 4) {
          *(undefined1 *)((long)puVar3 + 0x12) = 1;
          uVar6 = puVar3[1];
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eb6c;
          iVar12 = snd_pcm_prepare(uVar6);
          if (-1 < iVar12) goto LAB_0010ec8a;
          poVar18 = (ostream *)&(this->super_RtApi).errorStream_;
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eb8f;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18,"RtApiAlsa::callbackEvent: error preparing device after overrun, ",0x40
                    );
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eb97;
          pcVar15 = (char *)snd_strerror(iVar12);
        }
        else {
          poVar1 = &(this->super_RtApi).errorStream_;
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eee6;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"RtApiAlsa::callbackEvent: error, current state is ",0x32);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eeee;
          pcVar15 = (char *)snd_pcm_state_name(iVar12);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10eef9;
          poVar18 = std::operator<<((ostream *)poVar1,pcVar15);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10ef10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
          *(undefined8 *)((long)pRVar23 + -8) = 0x10ef1a;
          pcVar15 = (char *)snd_strerror(0xffffffe0);
        }
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ef25;
        poVar18 = std::operator<<(poVar18,pcVar15);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ef39;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ef49;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ef58;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,(string *)local_70);
        if (local_70[0] != local_60) {
LAB_0010ec85:
          puVar8 = local_70[0];
          *(undefined8 *)((long)pRVar23 + -8) = 0x10ec8a;
          operator_delete(puVar8);
        }
      }
      else {
        poVar1 = &(this->super_RtApi).errorStream_;
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec2f;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"RtApiAlsa::callbackEvent: audio read error, ",0x2c);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec37;
        pcVar15 = (char *)snd_strerror(iVar10);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec42;
        poVar18 = std::operator<<((ostream *)poVar1,pcVar15);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec56;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec66;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ec75;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_RtApi).errorText_,(string *)local_70);
        iVar10 = local_34;
        if (local_70[0] != local_60) goto LAB_0010ec85;
      }
LAB_0010ec8a:
      *(undefined8 *)((long)pRVar23 + -8) = 0x10ec97;
      this_00 = this;
      RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
    }
    else {
      if ((this->super_RtApi).stream_.doByteSwap[1] == true) {
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ebb8;
        RtApi::byteSwapBuffer(this_01,pcVar15,uVar14 * uVar19,RVar5);
      }
      if ((this->super_RtApi).stream_.doConvertBuffer[1] == true) {
        pcVar15 = (this->super_RtApi).stream_.userBuffer[1];
        pcVar21 = (this->super_RtApi).stream_.deviceBuffer;
        *(undefined8 *)((long)pRVar23 + -8) = 0x10ebde;
        RtApi::convertBuffer
                  (&this->super_RtApi,pcVar15,pcVar21,(this->super_RtApi).stream_.convertInfo + 1);
      }
      this_00 = (RtApiAlsa *)puVar3[1];
      *(undefined8 *)((long)pRVar23 + -8) = 0x10ebee;
      iVar12 = snd_pcm_delay(this_00,&local_80);
      iVar10 = local_34;
      if (0 < (long)local_80 && iVar12 == 0) {
        (this->super_RtApi).stream_.latency[1] = local_80;
      }
    }
    SVar13 = (this->super_RtApi).stream_.mode;
  }
  __mutex_00 = local_48;
  if ((SVar13 & ~DUPLEX) != OUTPUT) goto LAB_0010f01a;
  if ((this->super_RtApi).stream_.doConvertBuffer[0] == true) {
    pcVar21 = (this->super_RtApi).stream_.userBuffer[0];
    pcVar15 = (this->super_RtApi).stream_.deviceBuffer;
    *(char *)((long)pRVar23 + -8) = -0x2b;
    *(char *)((long)pRVar23 + -7) = -0x14;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    this_00 = this;
    RtApi::convertBuffer(&this->super_RtApi,pcVar15,pcVar21,(this->super_RtApi).stream_.convertInfo)
    ;
    lVar16 = 0x260;
    lVar20 = 0x234;
  }
  else {
    pcVar15 = (this->super_RtApi).stream_.userBuffer[0];
    lVar16 = 600;
    lVar20 = 0x22c;
  }
  uVar19 = *(uint *)((long)&(this->super_RtApi)._vptr_RtApi + lVar20);
  pcVar21 = *(char **)((long)&(this->super_RtApi)._vptr_RtApi + lVar16);
  if ((this->super_RtApi).stream_.doByteSwap[0] == true) {
    uVar14 = (this->super_RtApi).stream_.bufferSize;
    local_40 = pcVar21;
    *(char *)((long)pRVar23 + -8) = '\x1d';
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    RtApi::byteSwapBuffer(&this_00->super_RtApi,pcVar15,uVar14 * uVar19,(RtAudioFormat)pcVar21);
    pcVar21 = local_40;
  }
  if ((this->super_RtApi).stream_.deviceInterleaved[0] == true) {
    uVar6 = *puVar3;
    uVar19 = (this->super_RtApi).stream_.bufferSize;
    *(char *)((long)pRVar23 + -8) = '<';
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar12 = snd_pcm_writei(uVar6,pcVar15,uVar19);
  }
  else {
    lVar16 = (long)pRVar23 - ((ulong)uVar19 * 8 + 0xf & 0xfffffffffffffff0);
    local_50 = CONCAT44(local_50._4_4_,(this->super_RtApi).stream_.bufferSize);
    local_40 = (char *)pRVar23;
    *(undefined8 *)(lVar16 + -8) = 0x10ed6e;
    uVar14 = RtApi::formatBytes(&this->super_RtApi,(RtAudioFormat)pcVar21);
    if (0 < (int)uVar19) {
      uVar14 = uVar14 * (int)local_50;
      uVar22 = 0;
      do {
        *(char **)(lVar16 + uVar22 * 8) = pcVar15;
        uVar22 = uVar22 + 1;
        pcVar15 = pcVar15 + uVar14;
      } while (uVar19 != uVar22);
    }
    uVar6 = *puVar3;
    uVar19 = (this->super_RtApi).stream_.bufferSize;
    *(undefined8 *)(lVar16 + -8) = 0x10ed9a;
    iVar12 = snd_pcm_writen(uVar6,lVar16,uVar19);
    pRVar23 = (RtAudioFormat *)local_40;
  }
  iVar10 = local_34;
  if ((int)(this->super_RtApi).stream_.bufferSize <= iVar12) {
    uVar6 = *puVar3;
    *(char *)((long)pRVar23 + -8) = '\x04';
    *(char *)((long)pRVar23 + -7) = -0x12;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar12 = snd_pcm_delay(uVar6,&local_80);
    __mutex_00 = local_48;
    if (0 < (long)local_80 && iVar12 == 0) {
      (this->super_RtApi).stream_.latency[0] = local_80;
    }
    goto LAB_0010f01a;
  }
  if (iVar12 == -0x20) {
    uVar6 = *puVar3;
    *(char *)((long)pRVar23 + -8) = -0x43;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar12 = snd_pcm_state(uVar6);
    if (iVar12 != 4) {
      poVar1 = &(this->super_RtApi).errorStream_;
      *(char *)((long)pRVar23 + -8) = -0x71;
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"RtApiAlsa::callbackEvent: error, current state is ",0x32);
      *(char *)((long)pRVar23 + -8) = -0x69;
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      pcVar15 = (char *)snd_pcm_state_name(iVar12);
      *(char *)((long)pRVar23 + -8) = -0x5e;
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      poVar18 = std::operator<<((ostream *)poVar1,pcVar15);
      *(char *)((long)pRVar23 + -8) = -0x47;
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,", ",2);
      *(char *)((long)pRVar23 + -8) = -0x3d;
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      pcVar15 = (char *)snd_strerror(0xffffffe0);
LAB_0010efbd:
      *(char *)((long)pRVar23 + -8) = -0x3b;
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      poVar18 = std::operator<<(poVar18,pcVar15);
      goto LAB_0010efd4;
    }
    *(undefined1 *)((long)puVar3 + 0x11) = 1;
    uVar6 = *puVar3;
    *(char *)((long)pRVar23 + -8) = -0x2c;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    iVar12 = snd_pcm_prepare(uVar6);
    if (iVar12 < 0) {
      poVar18 = (ostream *)&(this->super_RtApi).errorStream_;
      *(char *)((long)pRVar23 + -8) = -0x4e;
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar18,"RtApiAlsa::callbackEvent: error preparing device after underrun, ",0x41);
      *(char *)((long)pRVar23 + -8) = -0x46;
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      pcVar15 = (char *)snd_strerror(iVar12);
      goto LAB_0010efbd;
    }
    *(char *)((long)pRVar23 + -8) = -0x11;
    *(char *)((long)pRVar23 + -7) = -0x13;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__cxx11::string::operator=
              ((string *)&(this->super_RtApi).errorText_,
               "RtApiAlsa::callbackEvent: audio write error, underrun.");
  }
  else {
    poVar18 = (ostream *)&(this->super_RtApi).errorStream_;
    *(char *)((long)pRVar23 + -8) = 'E';
    *(char *)((long)pRVar23 + -7) = -0x12;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar18,"RtApiAlsa::callbackEvent: audio write error, ",0x2d);
    *(char *)((long)pRVar23 + -8) = 'M';
    *(char *)((long)pRVar23 + -7) = -0x12;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    pcVar15 = (char *)snd_strerror(iVar12);
    if (pcVar15 == (char *)0x0) {
      uVar6 = *(undefined8 *)(*(long *)poVar18 + -0x18);
      *(char *)((long)pRVar23 + -8) = -0x7a;
      *(char *)((long)pRVar23 + -7) = -0x11;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::ios::clear((int)poVar18 + (int)uVar6);
    }
    else {
      *(char *)((long)pRVar23 + -8) = 'a';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      sVar17 = strlen(pcVar15);
      *(char *)((long)pRVar23 + -8) = 'o';
      *(char *)((long)pRVar23 + -7) = -0x12;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar15,sVar17);
    }
LAB_0010efd4:
    *(char *)((long)pRVar23 + -8) = -0x27;
    *(char *)((long)pRVar23 + -7) = -0x11;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,".",1);
    *(char *)((long)pRVar23 + -8) = -0x17;
    *(char *)((long)pRVar23 + -7) = -0x11;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__cxx11::stringbuf::str();
    *(char *)((long)pRVar23 + -8) = -8;
    *(char *)((long)pRVar23 + -7) = -0x11;
    *(char *)((long)pRVar23 + -6) = '\x10';
    *(char *)((long)pRVar23 + -5) = '\0';
    *(char *)((long)pRVar23 + -4) = '\0';
    *(char *)((long)pRVar23 + -3) = '\0';
    *(char *)((long)pRVar23 + -2) = '\0';
    *(char *)((long)pRVar23 + -1) = '\0';
    std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,(string *)local_70);
    if (local_70[0] != local_60) {
      *(char *)((long)pRVar23 + -8) = '\t';
      *(char *)((long)pRVar23 + -7) = -0x10;
      *(char *)((long)pRVar23 + -6) = '\x10';
      *(char *)((long)pRVar23 + -5) = '\0';
      *(char *)((long)pRVar23 + -4) = '\0';
      *(char *)((long)pRVar23 + -3) = '\0';
      *(char *)((long)pRVar23 + -2) = '\0';
      *(char *)((long)pRVar23 + -1) = '\0';
      operator_delete(local_70[0]);
    }
  }
  __mutex_00 = local_48;
  *(char *)((long)pRVar23 + -8) = '\x1a';
  *(char *)((long)pRVar23 + -7) = -0x10;
  *(char *)((long)pRVar23 + -6) = '\x10';
  *(char *)((long)pRVar23 + -5) = '\0';
  *(char *)((long)pRVar23 + -4) = '\0';
  *(char *)((long)pRVar23 + -3) = '\0';
  *(char *)((long)pRVar23 + -2) = '\0';
  *(char *)((long)pRVar23 + -1) = '\0';
  RtApi::error(&this->super_RtApi,RTAUDIO_WARNING);
LAB_0010f01a:
  *(undefined8 *)((long)pRVar23 + -8) = 0x10f022;
  pthread_mutex_unlock(__mutex_00);
  (this->super_RtApi).stream_.streamTime =
       (double)(this->super_RtApi).stream_.bufferSize /
       (double)(this->super_RtApi).stream_.sampleRate + (this->super_RtApi).stream_.streamTime;
  if (iVar10 == 1) {
    p_Var7 = (this->super_RtApi)._vptr_RtApi[7];
    *(undefined8 *)((long)pRVar23 + -8) = 0x10f05e;
    (*p_Var7)(this);
  }
  return;
}

Assistant:

void RtApiAlsa :: callbackEvent()
{
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  if ( stream_.state == STREAM_STOPPED ) {
    MUTEX_LOCK( &stream_.mutex );
    while ( !apiInfo->runnable )
      pthread_cond_wait( &apiInfo->runnable_cv, &stream_.mutex );

    if ( stream_.state != STREAM_RUNNING ) {
      MUTEX_UNLOCK( &stream_.mutex );
      return;
    }
    MUTEX_UNLOCK( &stream_.mutex );
  }

  if ( stream_.state == STREAM_CLOSED ) {
    errorText_ = "RtApiAlsa::callbackEvent(): the stream is closed ... this shouldn't happen!";
    error( RTAUDIO_WARNING );
    return;
  }

  int doStopStream = 0;
  RtAudioCallback callback = (RtAudioCallback) stream_.callbackInfo.callback;
  double streamTime = getStreamTime();
  RtAudioStreamStatus status = 0;
  if ( stream_.mode != INPUT && apiInfo->xrun[0] == true ) {
    status |= RTAUDIO_OUTPUT_UNDERFLOW;
    apiInfo->xrun[0] = false;
  }
  if ( stream_.mode != OUTPUT && apiInfo->xrun[1] == true ) {
    status |= RTAUDIO_INPUT_OVERFLOW;
    apiInfo->xrun[1] = false;
  }
  doStopStream = callback( stream_.userBuffer[0], stream_.userBuffer[1],
                           stream_.bufferSize, streamTime, status, stream_.callbackInfo.userData );

  if ( doStopStream == 2 ) {
    abortStream();
    return;
  }

  MUTEX_LOCK( &stream_.mutex );

  // The state might change while waiting on a mutex.
  if ( stream_.state == STREAM_STOPPED ) goto unlock;

  int result;
  char *buffer;
  int channels;
  snd_pcm_t **handle;
  snd_pcm_sframes_t frames;
  RtAudioFormat format;
  handle = (snd_pcm_t **) apiInfo->handles;

  if ( stream_.mode == INPUT || stream_.mode == DUPLEX ) {

    // Setup parameters.
    if ( stream_.doConvertBuffer[1] ) {
      buffer = stream_.deviceBuffer;
      channels = stream_.nDeviceChannels[1];
      format = stream_.deviceFormat[1];
    }
    else {
      buffer = stream_.userBuffer[1];
      channels = stream_.nUserChannels[1];
      format = stream_.userFormat;
    }

    // Read samples from device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[1] )
      result = snd_pcm_readi( handle[1], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_readn( handle[1], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or overrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[1] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[1] = true;
          result = snd_pcm_prepare( handle[1] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after overrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio read error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto tryOutput;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[1] )
      byteSwapBuffer( buffer, stream_.bufferSize * channels, format );

    // Do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[1] )
      convertBuffer( stream_.userBuffer[1], stream_.deviceBuffer, stream_.convertInfo[1] );

    // Check stream latency
    result = snd_pcm_delay( handle[1], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[1] = frames;
  }

 tryOutput:

  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {

    // Setup parameters and do buffer conversion if necessary.
    if ( stream_.doConvertBuffer[0] ) {
      buffer = stream_.deviceBuffer;
      convertBuffer( buffer, stream_.userBuffer[0], stream_.convertInfo[0] );
      channels = stream_.nDeviceChannels[0];
      format = stream_.deviceFormat[0];
    }
    else {
      buffer = stream_.userBuffer[0];
      channels = stream_.nUserChannels[0];
      format = stream_.userFormat;
    }

    // Do byte swapping if necessary.
    if ( stream_.doByteSwap[0] )
      byteSwapBuffer(buffer, stream_.bufferSize * channels, format);

    // Write samples to device in interleaved/non-interleaved format.
    if ( stream_.deviceInterleaved[0] )
      result = snd_pcm_writei( handle[0], buffer, stream_.bufferSize );
    else {
      void *bufs[channels];
      size_t offset = stream_.bufferSize * formatBytes( format );
      for ( int i=0; i<channels; i++ )
        bufs[i] = (void *) (buffer + (i * offset));
      result = snd_pcm_writen( handle[0], bufs, stream_.bufferSize );
    }

    if ( result < (int) stream_.bufferSize ) {
      // Either an error or underrun occurred.
      if ( result == -EPIPE ) {
        snd_pcm_state_t state = snd_pcm_state( handle[0] );
        if ( state == SND_PCM_STATE_XRUN ) {
          apiInfo->xrun[0] = true;
          result = snd_pcm_prepare( handle[0] );
          if ( result < 0 ) {
            errorStream_ << "RtApiAlsa::callbackEvent: error preparing device after underrun, " << snd_strerror( result ) << ".";
            errorText_ = errorStream_.str();
          }
          else
            errorText_ =  "RtApiAlsa::callbackEvent: audio write error, underrun.";
        }
        else {
          errorStream_ << "RtApiAlsa::callbackEvent: error, current state is " << snd_pcm_state_name( state ) << ", " << snd_strerror( result ) << ".";
          errorText_ = errorStream_.str();
        }
      }
      else {
        errorStream_ << "RtApiAlsa::callbackEvent: audio write error, " << snd_strerror( result ) << ".";
        errorText_ = errorStream_.str();
      }
      error( RTAUDIO_WARNING );
      goto unlock;
    }

    // Check stream latency
    result = snd_pcm_delay( handle[0], &frames );
    if ( result == 0 && frames > 0 ) stream_.latency[0] = frames;
  }

 unlock:
  MUTEX_UNLOCK( &stream_.mutex );

  RtApi::tickStreamTime();
  if ( doStopStream == 1 ) this->stopStream();
}